

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall cmGeneratorTarget::AddCUDAToolkitFlags(cmGeneratorTarget *this,string *flags)

{
  cmMakefile *pcVar1;
  bool bVar2;
  string *psVar3;
  string_view source;
  string toolkitRoot;
  string sStack_78;
  string local_58;
  string local_38;
  
  pcVar1 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"CMAKE_CUDA_COMPILER_ID",(allocator<char> *)&sStack_78);
  psVar3 = cmMakefile::GetSafeDefinition(pcVar1,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  bVar2 = std::operator==(psVar3,"Clang");
  if (bVar2) {
    pcVar1 = this->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sStack_78,"CMAKE_CUDA_COMPILER_LIBRARY_ROOT",(allocator<char> *)&local_38)
    ;
    psVar3 = cmMakefile::GetSafeDefinition(pcVar1,&sStack_78);
    std::__cxx11::string::string((string *)&local_58,(string *)psVar3);
    std::__cxx11::string::~string((string *)&sStack_78);
    if (local_58._M_string_length != 0) {
      source._M_str = local_58._M_dataplus._M_p;
      source._M_len = local_58._M_string_length;
      cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                (&local_38,&this->LocalGenerator->super_cmOutputConverter,source,SHELL);
      std::operator+(&sStack_78," --cuda-path=",&local_38);
      std::__cxx11::string::append((string *)flags);
      std::__cxx11::string::~string((string *)&sStack_78);
      std::__cxx11::string::~string((string *)&local_38);
    }
    std::__cxx11::string::~string((string *)&local_58);
  }
  return;
}

Assistant:

void cmGeneratorTarget::AddCUDAToolkitFlags(std::string& flags) const
{
  std::string const& compiler =
    this->Makefile->GetSafeDefinition("CMAKE_CUDA_COMPILER_ID");

  if (compiler == "Clang") {
    // Pass CUDA toolkit explicitly to Clang.
    // Clang's searching for the system CUDA toolkit isn't very good and it's
    // expected the user will explicitly pass the toolkit path.
    // This also avoids Clang having to search for the toolkit on every
    // invocation.
    std::string toolkitRoot =
      this->Makefile->GetSafeDefinition("CMAKE_CUDA_COMPILER_LIBRARY_ROOT");

    if (!toolkitRoot.empty()) {
      flags += " --cuda-path=" +
        this->LocalGenerator->ConvertToOutputFormat(toolkitRoot,
                                                    cmOutputConverter::SHELL);
    }
  }
}